

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucci.cpp
# Opt level: O0

int ReadDigit(char **LineStr,int MaxValue)

{
  int RetValue;
  int MaxValue_local;
  char **LineStr_local;
  
  RetValue = 0;
  while (('/' < **LineStr && (**LineStr < ':'))) {
    RetValue = **LineStr + -0x30 + RetValue * 10;
    *LineStr = *LineStr + 1;
    if (MaxValue < RetValue) {
      RetValue = MaxValue;
    }
  }
  return RetValue;
}

Assistant:

int ReadDigit(const char *&LineStr, int MaxValue) {
    int RetValue;
    RetValue = 0;
    while (1) {
        if (*LineStr >= '0' && *LineStr <= '9') {
            RetValue *= 10;
            RetValue += *LineStr - '0';
            LineStr ++;
            if (RetValue > MaxValue) {
                RetValue = MaxValue;
            }
        } else {
            break;
        }
    }
    return RetValue;
}